

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# play.c
# Opt level: O0

float xm_waveform(xm_waveform_type_t waveform,uint8_t step)

{
  byte bVar1;
  byte in_SIL;
  undefined4 in_EDI;
  float local_1c;
  float local_4;
  
  bVar1 = in_SIL & 0x3f;
  switch(in_EDI) {
  case 0:
    local_4 = sinf(((float)bVar1 * 6.283184) / 64.0);
    local_4 = -local_4;
    break;
  case 1:
    local_4 = (float)(int)(0x20 - (uint)bVar1) / 32.0;
    break;
  case 2:
    local_1c = 1.0;
    if (bVar1 < 0x20) {
      local_1c = -1.0;
    }
    local_4 = local_1c;
    break;
  case 3:
    xm_waveform::next_rand = xm_waveform::next_rand * 0x41c64e6d + 0x3039;
    local_4 = (float)(xm_waveform::next_rand >> 0x10 & 0x7fff) / 16384.0 - 1.0;
    break;
  case 4:
    local_4 = (float)(int)(bVar1 - 0x20) / 32.0;
    break;
  default:
    local_4 = 0.0;
  }
  return local_4;
}

Assistant:

static float xm_waveform(xm_waveform_type_t waveform, uint8_t step) {
	static unsigned int next_rand = 24492;
	step %= 0x40;

	switch(waveform) {

	case XM_SINE_WAVEFORM:
		/* Why not use a table? For saving space, and because there's
		 * very very little actual performance gain. */
		return -sinf(2.f * 3.141592f * (float)step / (float)0x40);

	case XM_RAMP_DOWN_WAVEFORM:
		/* Ramp down: 1.0f when step = 0; -1.0f when step = 0x40 */
		return (float)(0x20 - step) / 0x20;

	case XM_SQUARE_WAVEFORM:
		/* Square with a 50% duty */
		return (step >= 0x20) ? 1.f : -1.f;

	case XM_RANDOM_WAVEFORM:
		/* Use the POSIX.1-2001 example, just to be deterministic
		 * across different machines */
		next_rand = next_rand * 1103515245 + 12345;
		return (float)((next_rand >> 16) & 0x7FFF) / (float)0x4000 - 1.f;

	case XM_RAMP_UP_WAVEFORM:
		/* Ramp up: -1.f when step = 0; 1.f when step = 0x40 */
		return (float)(step - 0x20) / 0x20;

	default:
		break;

	}

	return .0f;
}